

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void keyscan_break(tgestate_t *state)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long in_RDI;
  int shift;
  int space;
  
  bVar1 = (*(code *)**(undefined8 **)(in_RDI + 0x18))(*(undefined8 *)(in_RDI + 0x18),0x7ffe);
  uVar2 = (uint)((bVar1 & 1) == 0);
  bVar1 = (*(code *)**(undefined8 **)(in_RDI + 0x18))(*(undefined8 *)(in_RDI + 0x18),0xfefe);
  uVar3 = (uint)((bVar1 & 1) == 0);
  if ((uVar2 != 0) && (uVar3 != 0)) {
    screen_reset((tgestate_t *)0x109325);
    iVar4 = user_confirm((tgestate_t *)CONCAT44(uVar2,uVar3));
    if (iVar4 == 0) {
      reset_game((tgestate_t *)CONCAT44(uVar2,uVar3));
    }
    else if (*(char *)(in_RDI + 0x120) == '\0') {
      reset_outdoors((tgestate_t *)0x10935b);
    }
    else {
      enter_room((tgestate_t *)0x109367);
    }
  }
  return;
}

Assistant:

void keyscan_break(tgestate_t *state)
{
  int space;
  int shift;

  assert(state != NULL);

  /* Is shift-space (break) pressed? */
  space = (state->speccy->in(state->speccy, port_KEYBOARD_SPACESYMSHFTMNB) & 1) == 0;
  shift = (state->speccy->in(state->speccy, port_KEYBOARD_SHIFTZXCV)       & 1) == 0;
  if (!space || !shift)
    return; /* not pressed */

  screen_reset(state);
  if (user_confirm(state) == 0)
  {
    reset_game(state);
    NEVER_RETURNS;
  }

  if (state->room_index == room_0_OUTDOORS)
  {
    reset_outdoors(state);
  }
  else
  {
    enter_room(state); /* doesn't return (jumps to main_loop) */
    NEVER_RETURNS;
  }
}